

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void ft_cmap_done_internal(FT_CMap_conflict cmap)

{
  FT_Memory pFVar1;
  FT_CMap_DoneFunc p_Var2;
  
  pFVar1 = ((cmap->charmap).face)->memory;
  p_Var2 = cmap->clazz->done;
  if (p_Var2 != (FT_CMap_DoneFunc)0x0) {
    (*p_Var2)(cmap);
  }
  (*pFVar1->free)(pFVar1,cmap);
  return;
}

Assistant:

static void
  ft_cmap_done_internal( FT_CMap  cmap )
  {
    FT_CMap_Class  clazz  = cmap->clazz;
    FT_Face        face   = cmap->charmap.face;
    FT_Memory      memory = FT_FACE_MEMORY( face );


    if ( clazz->done )
      clazz->done( cmap );

    FT_FREE( cmap );
  }